

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float32_to_float128_mips(float32 a,float_status *status)

{
  commonNaNT a_00;
  float128 fVar1;
  commonNaNT local_50;
  uint32_t local_34;
  int local_30;
  uint32_t aSig;
  int aExp;
  flag aSign;
  float_status *status_local;
  undefined1 auStack_18 [4];
  float32 a_local;
  
  _aExp = status;
  status_local._4_4_ = a;
  status_local._4_4_ = float32_squash_input_denormal_mips(a,status);
  local_34 = extractFloat32Frac(status_local._4_4_);
  local_30 = extractFloat32Exp(status_local._4_4_);
  aSig._3_1_ = extractFloat32Sign(status_local._4_4_);
  if (local_30 == 0xff) {
    if (local_34 == 0) {
      _auStack_18 = packFloat128(aSig._3_1_,0x7fff,0,0);
    }
    else {
      float32ToCommonNaN(&local_50,status_local._4_4_,_aExp);
      a_00.high = local_50.high;
      a_00.sign = local_50.sign;
      a_00._1_7_ = local_50._1_7_;
      a_00.low = local_50.low;
      _auStack_18 = commonNaNToFloat128(a_00,_aExp);
    }
  }
  else {
    if (local_30 == 0) {
      if (local_34 == 0) {
        fVar1 = packFloat128(aSig._3_1_,0,0,0);
        return fVar1;
      }
      normalizeFloat32Subnormal(local_34,&local_30,&local_34);
      local_30 = local_30 + -1;
    }
    _auStack_18 = packFloat128(aSig._3_1_,local_30 + 0x3f80,(ulong)local_34 << 0x19,0);
  }
  return _auStack_18;
}

Assistant:

float128 float32_to_float128(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    if ( aExp == 0xFF ) {
        if (aSig) {
            return commonNaNToFloat128(float32ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    return packFloat128( aSign, aExp + 0x3F80, ( (uint64_t) aSig )<<25, 0 );

}